

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O2

ostream * plot::detail::braille::operator<<(ostream *stream,line_t *line)

{
  BrailleCanvas *pBVar1;
  TerminalMode TVar2;
  ostream *poVar3;
  byte bVar4;
  long lVar5;
  block_t *this;
  Color CVar6;
  foreground_setter local_44;
  
  pBVar1 = line->canvas_;
  TVar2 = (pBVar1->term_).mode;
  if ((TVar2 != None) && (TVar2 != Windows)) {
    ansi::reset(stream);
    TVar2 = (pBVar1->term_).mode;
  }
  if ((TVar2 != None) && (TVar2 != Windows)) {
    ansi::bold(stream);
  }
  this = (line->it_)._M_current;
  for (lVar5 = pBVar1->cols_ * 0x14; lVar5 != 0; lVar5 = lVar5 + -0x14) {
    if (this->pixels == '\0') {
      bVar4 = 0x20;
      poVar3 = stream;
    }
    else {
      CVar6 = Color::over(&this->color,&pBVar1->background_);
      local_44.color.a = CVar6.a;
      local_44.color.r = CVar6.r * local_44.color.a;
      local_44.color.g = CVar6.g * local_44.color.a;
      local_44.color.b = local_44.color.a * CVar6.b;
      local_44.mode = (pBVar1->term_).mode;
      poVar3 = detail::operator<<(stream,&local_44);
      poVar3 = std::operator<<(poVar3,-0x1e);
      poVar3 = std::operator<<(poVar3,this->pixels >> 6 | 0xa0);
      bVar4 = this->pixels & 0x3f | 0x80;
    }
    std::operator<<(poVar3,bVar4);
    this = this + 1;
  }
  TVar2 = (pBVar1->term_).mode;
  if ((TVar2 != None) && (TVar2 != Windows)) {
    ansi::reset(stream);
  }
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, line_t const& line) {
        auto const& canvas = *line.canvas_;
        auto const& term = canvas.term_;

        // Reset attributes + Bold mode
        // XXX: Empty dots in braille patterns are often rendered as empty
        // XXX: circles unless in bold mode.
        stream << term.reset() << term.bold();

        // Unicode braille patterns are 0x28xx
        // In binary:
        //   0b00101000'xxxxxxxx
        // In UTF-8:
        //   0b1110'0010, 0b10'1000'xx 0b10'xxxxxx

        for (auto it = line.it_, end = line.it_+canvas.cols_; it != end; ++it) {
            if (it->pixels) {
                stream << term.foreground(it->color.over(canvas.background_).premultiplied())
                       << char(0b1110'0010)
                       << char(0b10'1000'00 | ((it->pixels & 0b11'000000) >> 6))
                       << char(0b10'000000 | (it->pixels & 0b00'111111));
            } else {
                stream << ' ';
            }
        }

        return stream << term.reset();
    }